

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::prefixUnary(Parser *this,TokIter *iter,TokIter end)

{
  TokIter iter_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_t sVar2;
  size_t sVar3;
  TokenID TVar4;
  mapped_type *pmVar5;
  SyntaxError *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>
  __tmp;
  shared_ptr<mocker::ast::Expression> *args_1;
  shared_ptr<mocker::ast::Expression> sVar6;
  Position beg;
  Position end_00;
  shared_ptr<mocker::ast::Expression> res;
  undefined1 local_98 [32];
  vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> prefix;
  Position begPos;
  element_type *local_40;
  GetTokenID id;
  
  Token::position(*end._M_current);
  begPos.line = CONCAT44(local_98._4_4_,local_98._0_4_);
  begPos.col = local_98._8_8_;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              iter_00._M_current = *end._M_current;
              *(Token **)end._M_current = iter_00._M_current + 1;
              TVar4 = GetTokenID::operator()(&id,iter_00);
            } while (TVar4 == Plus);
            if (TVar4 != Minus) break;
            local_98._0_4_ = Neg;
            std::
            vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ::emplace_back<mocker::ast::UnaryExpr::OpType>(&prefix,(OpType *)local_98);
          }
          if (TVar4 != LogicalNot) break;
          local_98._0_4_ = LogicalNot;
          std::
          vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
          emplace_back<mocker::ast::UnaryExpr::OpType>(&prefix,(OpType *)local_98);
        }
        if (TVar4 != BitNot) break;
        local_98._0_4_ = BitNot;
        std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ::emplace_back<mocker::ast::UnaryExpr::OpType>(&prefix,(OpType *)local_98);
      }
      if (TVar4 != PlusPlus) break;
      local_98._0_4_ = PreInc;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>(&prefix,(OpType *)local_98);
    }
    if (TVar4 != MinusMinus) break;
    local_98._0_4_ = PreDec;
    std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
    emplace_back<mocker::ast::UnaryExpr::OpType>(&prefix,(OpType *)local_98);
  }
  *(long *)end._M_current = *(long *)end._M_current + -0x38;
  suffixIncDec((Parser *)&res,iter,end);
  if (res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (SyntaxError *)__cxa_allocate_exception(0x48);
      Token::position(*end._M_current);
      SyntaxError::SyntaxError(this_00,&begPos,(Position *)(local_98 + 0x10));
      __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
  }
  else {
    args_1 = (shared_ptr<mocker::ast::Expression> *)
             prefix.
             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (sVar3 = begPos.col, sVar2 = begPos.line,
          _Var1._M_pi = res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,
          args_1 != (shared_ptr<mocker::ast::Expression> *)
                    prefix.
                    super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
      local_40 = res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_40);
      args_1 = (shared_ptr<mocker::ast::Expression> *)
               ((long)&args_1[-1].
                       super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4);
      beg.col = sVar2;
      beg.line = (size_t)iter;
      end_00.col = (pmVar5->second).line;
      end_00.line = sVar3;
      makeNode<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType&,std::shared_ptr<mocker::ast::Expression>&>
                ((Parser *)local_98,beg,end_00,(OpType *)(pmVar5->second).col,args_1);
      std::__shared_ptr<mocker::ast::Expression,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<mocker::ast::Expression,(__gnu_cxx::_Lock_policy)2> *)&res,
                 (__shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2> *)local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    }
    res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->tokBeg)._M_current =
         (Token *)res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (this->tokEnd)._M_current = (Token *)_Var1._M_pi;
    res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ::~_Vector_base(&prefix.
                   super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                 );
  sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::prefixUnary(TokIter &iter,
                                                     TokIter end) {
  // ++, --, +, -, !, ~
  // prefix '+' will be ignored
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  std::vector<ast::UnaryExpr::OpType> prefix;
  bool flag = true;
  while (flag) {
    switch (id(iter++)) {
    case TokenID::PlusPlus:
      prefix.emplace_back(ast::UnaryExpr::PreInc);
      break;
    case TokenID::MinusMinus:
      prefix.emplace_back(ast::UnaryExpr::PreDec);
      break;
    case TokenID::Plus:
      break;
    case TokenID::Minus:
      prefix.emplace_back(ast::UnaryExpr::Neg);
      break;
    case TokenID::LogicalNot:
      prefix.emplace_back(ast::UnaryExpr::LogicalNot);
      break;
    case TokenID::BitNot:
      prefix.emplace_back(ast::UnaryExpr::BitNot);
      break;
    default:
      --iter;
      flag = false;
      break;
    }
  }

  auto res = suffixIncDec(iter, end);
  if (!res) {
    if (prefix.empty())
      return nullptr;
    throw SyntaxError(begPos, iter->position().second);
  }

  for (auto riter = prefix.rbegin(); riter != prefix.rend(); ++riter)
    res =
        makeNode<ast::UnaryExpr>(begPos, pos[res->getID()].second, *riter, res);

  return res;
}